

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

ParticleUpperBound * __thiscall
despot::BaseTag::CreateParticleUpperBound(BaseTag *this,string *name)

{
  bool bVar1;
  TagSPParticleUpperBound *this_00;
  TagManhattanUpperBound *this_01;
  ostream *poVar2;
  
  bVar1 = std::operator==(name,"TRIVIAL");
  if (bVar1) {
    this_00 = (TagSPParticleUpperBound *)operator_new(0x10);
    despot::TrivialParticleUpperBound::TrivialParticleUpperBound
              ((TrivialParticleUpperBound *)this_00,(DSPOMDP *)&this->super_BeliefMDP);
  }
  else {
    bVar1 = std::operator==(name,"MDP");
    if (bVar1) {
      this_00 = (TagSPParticleUpperBound *)operator_new(0x38);
      despot::MDPUpperBound::MDPUpperBound
                ((MDPUpperBound *)this_00,&this->super_MDP,&this->super_StateIndexer);
    }
    else {
      bVar1 = std::operator==(name,"SP");
      if ((!bVar1) && (bVar1 = std::operator==(name,"DEFAULT"), !bVar1)) {
        bVar1 = std::operator==(name,"MANHATTAN");
        if (bVar1) {
          this_01 = (TagManhattanUpperBound *)operator_new(0x30);
          TagManhattanUpperBound::TagManhattanUpperBound(this_01,this);
          return &this_01->super_ParticleUpperBound;
        }
        bVar1 = std::operator!=(name,"print");
        if (bVar1) {
          poVar2 = std::operator<<((ostream *)&std::cerr,"Unsupported particle lower bound: ");
          poVar2 = std::operator<<(poVar2,(string *)name);
          std::endl<char,std::char_traits<char>>(poVar2);
        }
        poVar2 = std::operator<<((ostream *)&std::cerr,
                                 "Supported types: TRIVIAL, MDP, SP, MANHATTAN (default to SP)");
        std::endl<char,std::char_traits<char>>(poVar2);
        exit(1);
      }
      this_00 = (TagSPParticleUpperBound *)operator_new(0x28);
      TagSPParticleUpperBound::TagSPParticleUpperBound(this_00,this);
    }
  }
  return &this_00->super_ParticleUpperBound;
}

Assistant:

ParticleUpperBound* BaseTag::CreateParticleUpperBound(string name) const {
	if (name == "TRIVIAL") {
		return  new TrivialParticleUpperBound(this);
	} else if (name == "MDP") {
		return new MDPUpperBound(this, *this);
	} else if (name == "SP" || name == "DEFAULT") {
		return new TagSPParticleUpperBound(this);
	} else if (name == "MANHATTAN") {
		return new TagManhattanUpperBound(this);
	} else {
		if (name != "print")
			cerr << "Unsupported particle lower bound: " << name << endl;
		cerr << "Supported types: TRIVIAL, MDP, SP, MANHATTAN (default to SP)" << endl;
		exit(1);
		return NULL;
	}
}